

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterSort(SortSubtask *pTask,SorterList *pList)

{
  u8 uVar1;
  uint uVar2;
  SorterCompare p_Var3;
  SorterRecord *pSVar4;
  SorterRecord *pSVar5;
  code *pcVar6;
  undefined8 *puVar7;
  SorterRecord *pSVar8;
  long lVar9;
  SorterRecord *aSlot [64];
  undefined8 local_238 [65];
  
  uVar2 = vdbeSortAllocUnpacked(pTask);
  if (uVar2 == 0) {
    pSVar4 = pList->pList;
    uVar1 = pTask->pSorter->typeMask;
    pcVar6 = vdbeSorterCompare;
    if (uVar1 == '\x02') {
      pcVar6 = vdbeSorterCompareText;
    }
    p_Var3 = vdbeSorterCompareInt;
    if (uVar1 != '\x01') {
      p_Var3 = pcVar6;
    }
    pTask->xCompare = p_Var3;
    memset(local_238,0,0x200);
    while (pSVar4 != (SorterRecord *)0x0) {
      pSVar8 = (SorterRecord *)pList->aMemory;
      if (pSVar8 == (SorterRecord *)0x0) {
        pSVar8 = (pSVar4->u).pNext;
      }
      else if (pSVar4 == pSVar8) {
        pSVar8 = (SorterRecord *)0x0;
      }
      else {
        pSVar8 = (SorterRecord *)((long)&pSVar8->nVal + (long)(pSVar4->u).iNext);
      }
      (pSVar4->u).pNext = (SorterRecord *)0x0;
      for (puVar7 = local_238; (SorterRecord *)*puVar7 != (SorterRecord *)0x0; puVar7 = puVar7 + 1)
      {
        pSVar4 = vdbeSorterMerge(pTask,pSVar4,(SorterRecord *)*puVar7);
        *puVar7 = 0;
      }
      *puVar7 = pSVar4;
      pSVar4 = pSVar8;
    }
    pSVar4 = (SorterRecord *)0x0;
    for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
      pSVar8 = (SorterRecord *)local_238[lVar9];
      pSVar5 = pSVar4;
      if ((pSVar8 != (SorterRecord *)0x0) && (pSVar5 = pSVar8, pSVar4 != (SorterRecord *)0x0)) {
        pSVar5 = vdbeSorterMerge(pTask,pSVar4,pSVar8);
      }
      pSVar4 = pSVar5;
    }
    pList->pList = pSVar4;
    uVar2 = (uint)pTask->pUnpacked->errCode;
  }
  return uVar2;
}

Assistant:

static int vdbeSorterSort(SortSubtask *pTask, SorterList *pList){
  int i;
  SorterRecord *p;
  int rc;
  SorterRecord *aSlot[64];

  rc = vdbeSortAllocUnpacked(pTask);
  if( rc!=SQLITE_OK ) return rc;

  p = pList->pList;
  pTask->xCompare = vdbeSorterGetCompare(pTask->pSorter);
  memset(aSlot, 0, sizeof(aSlot));

  while( p ){
    SorterRecord *pNext;
    if( pList->aMemory ){
      if( (u8*)p==pList->aMemory ){
        pNext = 0;
      }else{
        assert( p->u.iNext<sqlite3MallocSize(pList->aMemory) );
        pNext = (SorterRecord*)&pList->aMemory[p->u.iNext];
      }
    }else{
      pNext = p->u.pNext;
    }

    p->u.pNext = 0;
    for(i=0; aSlot[i]; i++){
      p = vdbeSorterMerge(pTask, p, aSlot[i]);
      aSlot[i] = 0;
    }
    aSlot[i] = p;
    p = pNext;
  }

  p = 0;
  for(i=0; i<ArraySize(aSlot); i++){
    if( aSlot[i]==0 ) continue;
    p = p ? vdbeSorterMerge(pTask, p, aSlot[i]) : aSlot[i];
  }
  pList->pList = p;

  assert( pTask->pUnpacked->errCode==SQLITE_OK
       || pTask->pUnpacked->errCode==SQLITE_NOMEM
  );
  return pTask->pUnpacked->errCode;
}